

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBreak * AnalyzeBreak(ExpressionContext *ctx,SynBreak *syntax)

{
  SynNumber *source;
  TypeBase *type;
  ExprBase *pEVar1;
  ExprIntegerLiteral *pEVar2;
  ExprBreak *this;
  FunctionData *onwerFunction;
  ExprIntegerLiteral *number;
  ExprBase *numberValue;
  uint depth;
  SynBreak *syntax_local;
  ExpressionContext *ctx_local;
  
  numberValue._4_4_ = 1;
  if (syntax->number != (SynNumber *)0x0) {
    pEVar1 = AnalyzeExpression(ctx,&syntax->number->super_SynBase);
    source = syntax->number;
    pEVar1 = CreateCast(ctx,&syntax->number->super_SynBase,pEVar1,ctx->typeLong,false);
    pEVar1 = anon_unknown.dwarf_e7629::EvaluateExpression(ctx,&source->super_SynBase,pEVar1);
    pEVar2 = getType<ExprIntegerLiteral>(pEVar1);
    if (pEVar2 == (ExprIntegerLiteral *)0x0) {
      anon_unknown.dwarf_e7629::Stop
                (ctx,&syntax->number->super_SynBase,
                 "ERROR: break statement must be followed by \';\' or a constant");
    }
    else {
      if (pEVar2->value < 1) {
        anon_unknown.dwarf_e7629::Stop
                  (ctx,&syntax->number->super_SynBase,
                   "ERROR: break level can\'t be negative or zero");
      }
      numberValue._4_4_ = (uint)pEVar2->value;
    }
  }
  if (ctx->scope->breakDepth < numberValue._4_4_) {
    anon_unknown.dwarf_e7629::Stop
              (ctx,&syntax->super_SynBase,"ERROR: break level is greater that loop depth");
  }
  this = ExpressionContext::get<ExprBreak>(ctx);
  type = ctx->typeVoid;
  onwerFunction = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
  pEVar1 = CreateBreakUpvalueClose
                     (ctx,&syntax->super_SynBase,onwerFunction,ctx->scope,numberValue._4_4_);
  ExprBreak::ExprBreak(this,&syntax->super_SynBase,type,numberValue._4_4_,pEVar1);
  return this;
}

Assistant:

ExprBreak* AnalyzeBreak(ExpressionContext &ctx, SynBreak *syntax)
{
	unsigned depth = 1;

	if(syntax->number)
	{
		ExprBase *numberValue = AnalyzeExpression(ctx, syntax->number);

		if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, syntax->number, CreateCast(ctx, syntax->number, numberValue, ctx.typeLong, false))))
		{
			if(number->value <= 0)
				Stop(ctx, syntax->number, "ERROR: break level can't be negative or zero");

			depth = unsigned(number->value);
		}
		else
		{
			Stop(ctx, syntax->number, "ERROR: break statement must be followed by ';' or a constant");
		}
	}

	if(ctx.scope->breakDepth < depth)
		Stop(ctx, syntax, "ERROR: break level is greater that loop depth");

	return new (ctx.get<ExprBreak>()) ExprBreak(syntax, ctx.typeVoid, depth, CreateBreakUpvalueClose(ctx, syntax, ctx.GetCurrentFunction(ctx.scope), ctx.scope, depth));
}